

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

Array * __thiscall notch::core::Net::output(Net *this,Array *inputs)

{
  element_type *peVar1;
  pointer psVar2;
  Array *pAVar3;
  ulong uVar4;
  
  selfCheck(this);
  peVar1 = (((this->layers).
             super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pAVar3 = (Array *)(**(code **)((long)peVar1->_vptr_ABackpropLayer + 0x60))(peVar1,inputs);
  uVar4 = 1;
  while( true ) {
    psVar2 = (this->layers).
             super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->layers).
                      super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar4)
    break;
    peVar1 = psVar2[uVar4].
             super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pAVar3 = (Array *)(**(code **)((long)peVar1->_vptr_ABackpropLayer + 0x60))(peVar1,pAVar3);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  return pAVar3;
}

Assistant:

const Array &output(const Array &inputs) {
        selfCheck();
        const Array *out = &(layers[0]->output(inputs));
        for (auto i = 1u; i < layers.size(); ++i) {
            out = &(layers[i]->output(*out));
        }
        return *out;
    }